

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmCommonTargetGenerator::GetAIXExports
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *param_1)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  cmValue cVar2;
  string_view value;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = cmTarget::IsAIX(this->GeneratorTarget->Target);
  if (bVar1) {
    this_00 = this->GeneratorTarget;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AIX_EXPORT_ALL_SYMBOLS","")
    ;
    cVar2 = cmGeneratorTarget::GetProperty(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (cVar2.Value != (string *)0x0) {
      value._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      value._M_len = (cVar2.Value)->_M_string_length;
      bVar1 = cmValue::IsOff(value);
      if (bVar1) {
        std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x6e4302);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetAIXExports(std::string const&)
{
  std::string aixExports;
  if (this->GeneratorTarget->Target->IsAIX()) {
    if (cmValue exportAll =
          this->GeneratorTarget->GetProperty("AIX_EXPORT_ALL_SYMBOLS")) {
      if (cmIsOff(*exportAll)) {
        aixExports = "-n";
      }
    }
  }
  return aixExports;
}